

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O0

TsStatus_t ts_message_set_at(TsMessageRef_t array,size_t index,TsMessageRef_t item)

{
  TsMessageRef_t local_38;
  TsMessageRef_t current;
  size_t length;
  TsMessageRef_t item_local;
  size_t index_local;
  TsMessageRef_t array_local;
  
  if ((array == (TsMessageRef_t)0x0) || (array->type != TsTypeArray)) {
    array_local._4_4_ = TsStatusErrorPreconditionFailed;
  }
  else {
    length = (size_t)item;
    item_local = (TsMessageRef_t)index;
    index_local = (size_t)array;
    ts_message_get_size(array,(size_t *)&current);
    if ((item_local < (TsMessageRef_t)0xf) && (item_local <= current)) {
      if ((length == 0) && (item_local < (TsMessageRef_t)((long)&current[-1].value + 0x77U))) {
        array_local._4_4_ = TsStatusError;
      }
      else {
        local_38 = *(TsMessageRef_t *)(index_local + 0x20 + (long)item_local * 8);
        if (local_38 != (TsMessageRef_t)0x0) {
          *(undefined8 *)(index_local + 0x20 + (long)item_local * 8) = 0;
          ts_message_destroy(local_38);
        }
        ts_message_create_copy((TsMessageRef_t)length,&local_38);
        *(TsMessageRef_t *)(index_local + 0x20 + (long)item_local * 8) = local_38;
        array_local._4_4_ = TsStatusOk;
      }
    }
    else {
      array_local._4_4_ = TsStatusErrorIndexOutOfRange;
    }
  }
  return array_local._4_4_;
}

Assistant:

TsStatus_t ts_message_set_at(TsMessageRef_t array, size_t index, TsMessageRef_t item)
{
	/* check preconditions */
	if (array == NULL || array->type != TsTypeArray) {
		return TsStatusErrorPreconditionFailed;
	}
	size_t length;
	ts_message_get_size(array, &length);
	if (index >= TS_MESSAGE_MAX_BRANCHES || index > length) {
		return TsStatusErrorIndexOutOfRange;
	}

	/* note, passing NULL in item is the same as resizing the array */
	if (item == NULL && index < length - 1) {
		/* the caller should set the contents to NULL, not the item itself */
		return TsStatusErrorBadRequest;
	}

	/* remove old,... */
	TsMessageRef_t current = array->value._xfields[index];
	if (current != NULL) {
		array->value._xfields[index] = NULL;
		ts_message_destroy(current);
	}

	/* ...and set new and return */
	ts_message_create_copy(item, &current);
	array->value._xfields[index] = current;
	return TsStatusOk;
}